

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingSymbol
          (DescriptorPoolDatabase *this,StringViewArg symbol_name,FileDescriptorProto *output)

{
  FileDescriptor *this_00;
  string_view symbol_name_00;
  
  symbol_name_00._M_str = (symbol_name->_M_dataplus)._M_p;
  symbol_name_00._M_len = symbol_name->_M_string_length;
  this_00 = DescriptorPool::FindFileContainingSymbol(this->pool_,symbol_name_00);
  if (this_00 != (FileDescriptor *)0x0) {
    FileDescriptorProto::Clear(output);
    FileDescriptor::CopyTo(this_00,output);
    if ((this->options_).preserve_source_code_info == true) {
      FileDescriptor::CopySourceCodeInfoTo(this_00,output);
    }
  }
  return this_00 != (FileDescriptor *)0x0;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingSymbol(
    StringViewArg symbol_name, FileDescriptorProto* PROTOBUF_NONNULL output) {
  const FileDescriptor* file = pool_.FindFileContainingSymbol(symbol_name);
  if (file == nullptr) return false;
  output->Clear();
  file->CopyTo(output);
  if (options_.preserve_source_code_info) {
    file->CopySourceCodeInfoTo(output);
  }
  return true;
}